

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVApolynomialStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  int retval;
  int is;
  CVpolynomialDataMem content;
  CVadjMem ca_mem;
  int local_2c;
  
  lVar1 = *(long *)(in_RDI + 0xa70);
  puVar2 = *(undefined8 **)(in_RSI + 8);
  N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x150),*puVar2);
  if (*(int *)(lVar1 + 0xb8) != 0) {
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x90); local_2c = local_2c + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)local_2c * 8) = 0x3ff0000000000000;
    }
    iVar3 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0xa50),
                                *(undefined8 *)(in_RDI + 0x288),puVar2[1]);
    if (iVar3 != 0) {
      return -0x1c;
    }
  }
  *(undefined4 *)(puVar2 + 2) = *(undefined4 *)(in_RDI + 0x7fc);
  return 0;
}

Assistant:

static int CVApolynomialStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVpolynomialDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVpolynomialDataMem)d->content;

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }
    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  content->order = cv_mem->cv_qu;

  return (0);
}